

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandPSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint fSynthesize;
  int iVar3;
  Abc_Ntk_t *pNtk;
  abctime aVar4;
  int *__ptr;
  abctime aVar5;
  abctime time;
  char *pcVar6;
  char *pcVar7;
  uint fVerbose;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_44 = 1;
  local_48 = 1000000;
  local_4c = 10000;
  fSynthesize = 0;
  fVerbose = 1;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"APCpsvh"), iVar3 = globalUtilOptind, iVar1 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 0x50) break;
      if (iVar1 == 0x50) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
          goto LAB_0026e7f2;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_4c = uVar2;
        goto LAB_0026e6bf;
      }
      if (iVar1 == 0x70) {
        local_44 = local_44 ^ 1;
      }
      else {
        if (iVar1 != 0x73) goto LAB_0026e7fe;
        fSynthesize = fSynthesize ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        if (pNtk->nObjCounts[8] < 1) {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            aVar4 = Abc_Clock();
            iVar3 = Abc_NtkPartitionedSat
                              (pNtk,local_50,local_4c,0,local_48,local_44,fSynthesize,fVerbose);
            if (iVar3 == -1) {
              pcVar6 = "UNDECIDED      ";
            }
            else if (iVar3 == 0) {
              pcVar6 = "SATISFIABLE    ";
              if (pNtk->vPos->nSize == 1) {
                __ptr = Abc_NtkVerifySimulatePattern(pNtk,pNtk->pModel);
                if (*__ptr != 1) {
                  Abc_Print(1,"ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n")
                  ;
                }
                free(__ptr);
              }
            }
            else {
              pcVar6 = "UNSATISFIABLE  ";
            }
            Abc_Print(1,pcVar6);
            aVar5 = Abc_Clock();
            Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar6,time);
            return 0;
          }
          pcVar6 = "Currently only works for structurally hashed circuits.\n";
        }
        else {
          pcVar6 = "Currently can only solve the miter for combinational circuits.\n";
        }
        Abc_Print(-1,pcVar6);
        return 0;
      }
      pcVar6 = "Empty network.\n";
      iVar3 = -1;
      goto LAB_0026e988;
    }
    if (iVar1 == 0x41) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_0026e7f2;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_50 = uVar2;
    }
    else {
      if (iVar1 != 0x43) goto LAB_0026e7fe;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0026e7f2:
        Abc_Print(-1,pcVar6);
        goto LAB_0026e7fe;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
LAB_0026e6bf:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0026e7fe:
      Abc_Print(-2,"usage: psat [-APC num] [-psvh]\n");
      Abc_Print(-2,"\t         solves the combinational miter using partitioning\n");
      Abc_Print(-2,"\t         (derives CNF from the current network and leave it unchanged)\n");
      Abc_Print(-2,
                "\t         for multi-output miters, tries to prove that the AND of POs is always 0\n"
               );
      Abc_Print(-2,"\t         (if POs should be ORed instead of ANDed, use command \"orpos\")\n");
      Abc_Print(-2,"\t-A num : partitioning algorithm [default = %d]\n",(ulong)local_50);
      Abc_Print(-2,"\t         0 : no partitioning\n");
      Abc_Print(-2,"\t         1 : partitioning by level\n");
      Abc_Print(-2,"\t         2 : DFS post-order\n");
      Abc_Print(-2,"\t         3 : DFS pre-order\n");
      Abc_Print(-2,"\t         4 : bit-slicing\n");
      Abc_Print(-2,"\t         partitions are ordered by level (high level first)\n");
      Abc_Print(-2,"\t-P num : limit on the partition size [default = %d]\n",(ulong)local_4c);
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_48);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_44 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : align polarity of SAT variables [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (fSynthesize == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : apply logic synthesis to each partition [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0026e988:
      Abc_Print(iVar3,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int RetValue;
    int c;
    int nAlgo;
    int nPartSize;
    int nConfPart;
    int nConfTotal;
    int fAlignPol;
    int fSynthesize;
    int fVerbose;
    abctime clk;

    extern int Abc_NtkPartitionedSat( Abc_Ntk_t * pNtk, int nAlgo, int nPartSize, int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose );
    // set defaults
    nAlgo       =        0;
    nPartSize   =    10000;
    nConfPart   =        0;
    nConfTotal  =  1000000;
    fAlignPol   =        1;
    fSynthesize =        0;
    fVerbose    =        1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "APCpsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            nAlgo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAlgo < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfTotal = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfTotal < 0 )
                goto usage;
            break;
        case 'p':
            fAlignPol ^= 1;
            break;
        case 's':
            fSynthesize ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }

    clk = Abc_Clock();
    RetValue = Abc_NtkPartitionedSat( pNtk, nAlgo, nPartSize, nConfPart, nConfTotal, fAlignPol, fSynthesize, fVerbose );
    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        //int i;
        //Abc_Obj_t * pObj;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        /*
        // print model
        Abc_NtkForEachPi( pNtk, pObj, i )
        {
            Abc_Print( -1, "%d", (int)(pNtk->pModel[i] > 0) );
            if ( i == 70 )
                break;
        }
        Abc_Print( -1, "\n" );
        */
    }

    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;

usage:
    Abc_Print( -2, "usage: psat [-APC num] [-psvh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using partitioning\n" );
    Abc_Print( -2, "\t         (derives CNF from the current network and leave it unchanged)\n" );
    Abc_Print( -2, "\t         for multi-output miters, tries to prove that the AND of POs is always 0\n" );
    Abc_Print( -2, "\t         (if POs should be ORed instead of ANDed, use command \"orpos\")\n" );
    Abc_Print( -2, "\t-A num : partitioning algorithm [default = %d]\n", nAlgo );
    Abc_Print( -2, "\t         0 : no partitioning\n" );
    Abc_Print( -2, "\t         1 : partitioning by level\n" );
    Abc_Print( -2, "\t         2 : DFS post-order\n" );
    Abc_Print( -2, "\t         3 : DFS pre-order\n" );
    Abc_Print( -2, "\t         4 : bit-slicing\n" );
    Abc_Print( -2, "\t         partitions are ordered by level (high level first)\n" );
    Abc_Print( -2, "\t-P num : limit on the partition size [default = %d]\n", nPartSize );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfTotal );
    Abc_Print( -2, "\t-p     : align polarity of SAT variables [default = %s]\n", fAlignPol? "yes": "no" );
    Abc_Print( -2, "\t-s     : apply logic synthesis to each partition [default = %s]\n", fSynthesize? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}